

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_tran_conn_refused(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  nng_dialer local_38;
  nng_socket local_34;
  nng_dialer d;
  nng_socket s;
  
  local_34.id = 0;
  local_38.id = 0;
  pcVar5 = strchr(scheme,0x36);
  if (pcVar5 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0xf5,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr(scheme,0x40,nuts_tran_conn_refused::nuts_addr_);
  nVar2 = nng_pair1_open(&local_34);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0xf7,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    num = nng_dial(local_34,nuts_tran_conn_refused::nuts_addr_,&local_38,0);
    pcVar5 = nng_strerror(NNG_ECONNREFUSED);
    acutest_check_((uint)(num == NNG_ECONNREFUSED),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0xf8,"%s fails with %s","nng_dial(s, addr, &d, 0)",pcVar5,nVar2);
    pcVar5 = nng_strerror(NNG_ECONNREFUSED);
    pcVar6 = nng_strerror(num);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nng_dial(s, addr, &d, 0)",pcVar5,6,pcVar6,
                     (ulong)num);
    uVar4 = nng_dialer_id(local_38);
    acutest_check_(uVar4 >> 0x1f,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0xf9,"%s","nng_dialer_id(d) < 0");
    nVar2 = nng_socket_close(local_34);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0xfa,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar5,
                           nVar2);
    if (iVar3 != 0) {
      return;
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_conn_refused(const char *scheme)
{
	nng_socket  s = NNG_SOCKET_INITIALIZER;
	nng_dialer  d = NNG_DIALER_INITIALIZER;
	const char *addr;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR(addr, scheme);
	NUTS_OPEN(s);
	NUTS_FAIL(nng_dial(s, addr, &d, 0), NNG_ECONNREFUSED);
	NUTS_TRUE(nng_dialer_id(d) < 0);
	NUTS_CLOSE(s);
}